

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O0

void duckdb::udf_unary_function<duckdb::dtime_t>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  PhysicalType PVar1;
  bool bVar2;
  string_t *psVar3;
  string_t *psVar4;
  idx_t iVar5;
  char *__dest;
  char *__src;
  dtime_t *pdVar6;
  dtime_t *pdVar7;
  TemplatedValidityMask<unsigned_long> *pTVar8;
  Vector *in_RDX;
  DataChunk *in_RDI;
  anon_union_16_2_67f50693_for_value aVar9;
  idx_t i_1;
  ValidityMask mask;
  dtime_t *ldata_1;
  dtime_t *result_data_1;
  char *target_data;
  string_t target;
  idx_t input_length;
  idx_t i;
  ValidityMask *validity;
  string_t *ldata;
  string_t *result_data;
  ValidityMask *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff28;
  TemplatedValidityMask<unsigned_long> *this;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  TemplatedValidityMask<unsigned_long> *local_a0;
  ulong local_38;
  
  duckdb::DataChunk::Flatten();
  PVar1 = GetTypeId<duckdb::dtime_t>();
  if (PVar1 == VARCHAR) {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    psVar3 = FlatVector::GetData<duckdb::string_t>((Vector *)0x4cb057);
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)
               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (size_type)in_stack_ffffffffffffff18);
    psVar4 = FlatVector::GetData<duckdb::string_t>((Vector *)0x4cb078);
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)
               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (size_type)in_stack_ffffffffffffff18);
    FlatVector::Validity((Vector *)0x4cb099);
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)
               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (size_type)in_stack_ffffffffffffff18);
    FlatVector::Validity((Vector *)0x4cb0c7);
    FlatVector::SetValidity
              ((Vector *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    for (local_38 = 0; iVar5 = DataChunk::size(in_RDI), local_38 < iVar5; local_38 = local_38 + 1) {
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff28,
                         CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      if (bVar2) {
        iVar5 = string_t::GetSize(psVar4 + local_38);
        aVar9 = (anon_union_16_2_67f50693_for_value)duckdb::StringVector::EmptyString(in_RDX,iVar5);
        __dest = string_t::GetDataWriteable
                           ((string_t *)
                            CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
        __src = string_t::GetData((string_t *)
                                  CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
        memcpy(__dest,__src,iVar5);
        string_t::Finalize((string_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                          );
        psVar3[local_38].value = aVar9;
      }
    }
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    pdVar6 = FlatVector::GetData<duckdb::dtime_t>((Vector *)0x4cb23e);
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)
               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (size_type)in_stack_ffffffffffffff18);
    pdVar7 = FlatVector::GetData<duckdb::dtime_t>((Vector *)0x4cb269);
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)
               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (size_type)in_stack_ffffffffffffff18);
    FlatVector::Validity((Vector *)0x4cb28b);
    ValidityMask::ValidityMask
              ((ValidityMask *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    FlatVector::SetValidity
              ((Vector *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    local_a0 = (TemplatedValidityMask<unsigned_long> *)0x0;
    while (this = local_a0, pTVar8 = (TemplatedValidityMask<unsigned_long> *)DataChunk::size(in_RDI)
          , this < pTVar8) {
      in_stack_ffffffffffffff27 =
           TemplatedValidityMask<unsigned_long>::RowIsValid
                     (this,CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      if ((bool)in_stack_ffffffffffffff27) {
        pdVar6[(long)local_a0].micros = pdVar7[(long)local_a0].micros;
      }
      local_a0 = (TemplatedValidityMask<unsigned_long> *)((long)&local_a0->validity_mask + 1);
    }
    ValidityMask::~ValidityMask((ValidityMask *)0x4cb358);
  }
  return;
}

Assistant:

static void udf_unary_function(DataChunk &input, ExpressionState &state, Vector &result) {
	input.Flatten();
	switch (GetTypeId<TYPE>()) {
	case PhysicalType::VARCHAR: {
		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<string_t>(result);
		auto ldata = FlatVector::GetData<string_t>(input.data[0]);
		auto &validity = FlatVector::Validity(input.data[0]);

		FlatVector::SetValidity(result, FlatVector::Validity(input.data[0]));

		for (idx_t i = 0; i < input.size(); i++) {
			if (!validity.RowIsValid(i)) {
				continue;
			}
			auto input_length = ldata[i].GetSize();
			string_t target = StringVector::EmptyString(result, input_length);
			auto target_data = target.GetDataWriteable();
			memcpy(target_data, ldata[i].GetData(), input_length);
			target.Finalize();
			result_data[i] = target;
		}
		break;
	}
	default: {
		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<TYPE>(result);
		auto ldata = FlatVector::GetData<TYPE>(input.data[0]);
		auto mask = FlatVector::Validity(input.data[0]);
		FlatVector::SetValidity(result, mask);

		for (idx_t i = 0; i < input.size(); i++) {
			if (!mask.RowIsValid(i)) {
				continue;
			}
			result_data[i] = ldata[i];
		}
	}
	}
}